

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

CURLcode ossl_get_channel_binding(Curl_easy *data,int sockindex,dynbuf *binding)

{
  void *pvVar1;
  bool bVar2;
  int iVar3;
  CURLcode CVar4;
  X509 *data_00;
  EVP_MD *type;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  Curl_cfilter *pCVar8;
  int algo_nid;
  uint length;
  char prefix [22];
  uchar buf [64];
  uint local_a0;
  uint local_9c;
  char local_98 [32];
  uchar local_78 [72];
  
  builtin_strncpy(local_98,"tls-server-end-point:",0x16);
  pCVar8 = data->conn->cfilter[sockindex];
  lVar7 = 0;
  do {
    pcVar6 = pCVar8->cft->name;
    if (pcVar6 == (char *)0x0) {
LAB_0016daa7:
      if (pCVar8->next != (Curl_cfilter *)0x0) {
        pCVar8 = pCVar8->next;
      }
      bVar2 = true;
    }
    else {
      pvVar1 = pCVar8->ctx;
      iVar3 = strcmp(pcVar6,"SSL");
      if (iVar3 != 0) goto LAB_0016daa7;
      lVar7 = *(long *)((long)pvVar1 + 0x30);
      bVar2 = false;
    }
    if ((!bVar2) || (pCVar8->next == (Curl_cfilter *)0x0)) {
      if (lVar7 == 0) {
        Curl_failf(data,"Failed to find SSL backend for endpoint");
        return CURLE_SSL_ENGINE_INITFAILED;
      }
      data_00 = (X509 *)SSL_get1_peer_certificate(*(undefined8 *)(lVar7 + 8));
      if (data_00 == (X509 *)0x0) {
        return CURLE_OK;
      }
      iVar3 = X509_get_signature_nid(data_00);
      iVar3 = OBJ_find_sigid_algs(iVar3,(int *)&local_a0,(int *)0x0);
      if (iVar3 == 0) {
        pcVar6 = "Unable to find digest NID for certificate signature algorithm";
      }
      else {
        if ((local_a0 == 0x40) || (local_a0 == 4)) {
          type = EVP_sha256();
        }
        else {
          pcVar6 = OBJ_nid2sn(local_a0);
          type = EVP_get_digestbyname(pcVar6);
          if (type == (EVP_MD *)0x0) {
            pcVar5 = OBJ_nid2sn(local_a0);
            pcVar6 = "(null)";
            if (pcVar5 != (char *)0x0) {
              pcVar6 = pcVar5;
            }
            Curl_failf(data,"Could not find digest algorithm %s (NID %d)",pcVar6,(ulong)local_a0);
            return CURLE_SSL_INVALIDCERTSTATUS;
          }
        }
        iVar3 = X509_digest(data_00,type,local_78,&local_9c);
        if (iVar3 != 0) {
          CVar4 = Curl_dyn_addn(binding,local_98,0x15);
          if (CVar4 != CURLE_OK) {
            return CURLE_OUT_OF_MEMORY;
          }
          CVar4 = Curl_dyn_addn(binding,local_78,(ulong)local_9c);
          if (CVar4 == CURLE_OK) {
            return CURLE_OK;
          }
          return CURLE_OUT_OF_MEMORY;
        }
        pcVar6 = "X509_digest() failed";
      }
      Curl_failf(data,pcVar6);
      return CURLE_SSL_INVALIDCERTSTATUS;
    }
  } while( true );
}

Assistant:

static CURLcode ossl_get_channel_binding(struct Curl_easy *data, int sockindex,
                                         struct dynbuf *binding)
{
  /* required for X509_get_signature_nid support */
#if OPENSSL_VERSION_NUMBER > 0x10100000L
  X509 *cert;
  int algo_nid;
  const EVP_MD *algo_type;
  const char *algo_name;
  unsigned int length;
  unsigned char buf[EVP_MAX_MD_SIZE];

  const char prefix[] = "tls-server-end-point:";
  struct connectdata *conn = data->conn;
  struct Curl_cfilter *cf = conn->cfilter[sockindex];
  struct ossl_ctx *octx = NULL;

  do {
    const struct Curl_cftype *cft = cf->cft;
    struct ssl_connect_data *connssl = cf->ctx;

    if(cft->name && !strcmp(cft->name, "SSL")) {
      octx = (struct ossl_ctx *)connssl->backend;
      break;
    }

    if(cf->next)
      cf = cf->next;

  } while(cf->next);

  if(!octx) {
    failf(data,
          "Failed to find SSL backend for endpoint");
    return CURLE_SSL_ENGINE_INITFAILED;
  }

  cert = SSL_get1_peer_certificate(octx->ssl);
  if(!cert) {
    /* No server certificate, don't do channel binding */
    return CURLE_OK;
  }

  if(!OBJ_find_sigid_algs(X509_get_signature_nid(cert), &algo_nid, NULL)) {
    failf(data,
          "Unable to find digest NID for certificate signature algorithm");
    return CURLE_SSL_INVALIDCERTSTATUS;
  }

  /* https://datatracker.ietf.org/doc/html/rfc5929#section-4.1 */
  if(algo_nid == NID_md5 || algo_nid == NID_sha1) {
    algo_type = EVP_sha256();
  }
  else {
    algo_type = EVP_get_digestbynid(algo_nid);
    if(!algo_type) {
      algo_name = OBJ_nid2sn(algo_nid);
      failf(data, "Could not find digest algorithm %s (NID %d)",
            algo_name ? algo_name : "(null)", algo_nid);
      return CURLE_SSL_INVALIDCERTSTATUS;
    }
  }

  if(!X509_digest(cert, algo_type, buf, &length)) {
    failf(data, "X509_digest() failed");
    return CURLE_SSL_INVALIDCERTSTATUS;
  }

  /* Append "tls-server-end-point:" */
  if(Curl_dyn_addn(binding, prefix, sizeof(prefix) - 1) != CURLE_OK)
    return CURLE_OUT_OF_MEMORY;
  /* Append digest */
  if(Curl_dyn_addn(binding, buf, length))
    return CURLE_OUT_OF_MEMORY;

  return CURLE_OK;
#else
  /* No X509_get_signature_nid support */
  (void)data; /* unused */
  (void)sockindex; /* unused */
  (void)binding; /* unused */
  return CURLE_OK;
#endif
}